

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::disconnectBeforeStartTimeFixture::disconnectBeforeStartTimeFixture
          (disconnectBeforeStartTimeFixture *this)

{
  disconnectBeforeStartTimeFixture *this_local;
  
  acceptorFixture::acceptorFixture(&this->super_acceptorFixture);
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__disconnectBeforeStartTimeFixture_00460ea8;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application =
       (_func_int **)&PTR__disconnectBeforeStartTimeFixture_00460f00;
  FIX::UtcTimeOnly::setCurrent
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime);
  FIX::DateTime::operator+=
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.
              super_DateTime,100000000);
  FIX::UtcTimeOnly::setCurrent
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime);
  FIX::DateTime::operator+=
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
              super_DateTime,400000000);
  sessionFixture::createSession((sessionFixture *)this,0,-1,-1);
  return;
}

Assistant:

disconnectBeforeStartTimeFixture()
  {
    startTime.setCurrent();
    startTime += 100000000;
    endTime.setCurrent();
    endTime += 400000000;

    acceptorFixture::createSession( 0 );
  }